

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O0

wchar_t monster_elemental_damage
                  (melee_effect_handler_context_t *context,wchar_t type,mon_messages *hurt_msg,
                  mon_messages *die_msg)

{
  _Bool _Var1;
  monster_lore_conflict *pmVar2;
  wchar_t local_44;
  int local_40;
  wchar_t damage;
  wchar_t imm_flag;
  wchar_t hurt_flag;
  monster_lore *lore;
  mon_messages *die_msg_local;
  mon_messages *hurt_msg_local;
  wchar_t type_local;
  melee_effect_handler_context_t *context_local;
  
  pmVar2 = get_lore(context->t_mon->race);
  damage = L'\0';
  local_44 = L'\0';
  switch(type) {
  case L'\0':
    local_40 = 0x45;
    break;
  case L'\x01':
    local_40 = 0x46;
    break;
  case L'\x02':
    local_40 = 0x47;
    damage = L'C';
    *hurt_msg = MON_MSG_CATCH_FIRE;
    *die_msg = MON_MSG_DISINTEGRATES;
    break;
  case L'\x03':
    local_40 = 0x48;
    damage = L'D';
    *hurt_msg = MON_MSG_BADLY_FROZEN;
    *die_msg = MON_MSG_FREEZE_SHATTER;
    break;
  case L'\x04':
    local_40 = 0x49;
    break;
  default:
    return L'\0';
  }
  flag_on_dbg(pmVar2->flags,0xb,local_40,"lore->flags","imm_flag");
  if (damage != L'\0') {
    flag_on_dbg(pmVar2->flags,0xb,damage,"lore->flags","hurt_flag");
  }
  _Var1 = flag_has_dbg(context->t_mon->race->flags,0xb,local_40,"context->t_mon->race->flags",
                       "imm_flag");
  if (_Var1) {
    *hurt_msg = MON_MSG_RESIST_A_LOT;
    *die_msg = MON_MSG_DIE;
    local_44 = context->damage / 9;
  }
  else {
    _Var1 = flag_has_dbg(context->t_mon->race->flags,0xb,damage,"context->t_mon->race->flags",
                         "hurt_flag");
    if (_Var1) {
      local_44 = context->damage << 1;
    }
    else {
      *hurt_msg = MON_MSG_NONE;
      *die_msg = MON_MSG_DIE;
    }
  }
  return local_44;
}

Assistant:

static int monster_elemental_damage(melee_effect_handler_context_t *context,
									int type, enum mon_messages *hurt_msg,
									enum mon_messages *die_msg)
{
	struct monster_lore *lore = get_lore(context->t_mon->race);
	int hurt_flag = RF_NONE;
	int imm_flag = RF_NONE;
	int damage = 0;

	/* Deal with elemental types */
	switch (type) {
		case PROJ_ACID: {
			imm_flag = RF_IM_ACID;
			break;
		}
		case PROJ_ELEC: {
			imm_flag = RF_IM_ELEC;
			break;
		}
		case PROJ_FIRE: {
			imm_flag = RF_IM_FIRE;
			hurt_flag = RF_HURT_FIRE;
			*hurt_msg = MON_MSG_CATCH_FIRE;
			*die_msg = MON_MSG_DISINTEGRATES;
			break;
		}
		case PROJ_COLD: {
			imm_flag = RF_IM_COLD;
			hurt_flag = RF_HURT_COLD;
			*hurt_msg = MON_MSG_BADLY_FROZEN;
			*die_msg = MON_MSG_FREEZE_SHATTER;
			break;
		}
		case PROJ_POIS: {
			imm_flag = RF_IM_POIS;
			break;
		}
		default: return 0;
	}

	rf_on(lore->flags, imm_flag);
	if (hurt_flag) {
		rf_on(lore->flags, hurt_flag);
	}

	if (rf_has(context->t_mon->race->flags, imm_flag)) {
		*hurt_msg = MON_MSG_RESIST_A_LOT;
		*die_msg = MON_MSG_DIE;
		damage = context->damage / 9;
	} else if (rf_has(context->t_mon->race->flags, hurt_flag)) {
		damage = context->damage * 2;
	} else {
		*hurt_msg = MON_MSG_NONE;
		*die_msg = MON_MSG_DIE;
	}

	return damage;
}